

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QByteArray * QString::toUtf8_helper(QByteArray *__return_storage_ptr__,QString *str)

{
  char16_t *pcVar1;
  QStringView in;
  
  pcVar1 = (str->d).ptr;
  if (pcVar1 == (char16_t *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    in.m_size = (str->d).size;
    in.m_data = pcVar1;
    QUtf8::convertFromUnicode(__return_storage_ptr__,in);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QString::toUtf8_helper(const QString &str)
{
    return qt_convert_to_utf8(str);
}